

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

double __thiscall mpt::message_store::log(message_store *this,double __x)

{
  uint uVar1;
  content<mpt::message_store::entry> *pcVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  ulong pos;
  __va_list_tag *in_R8;
  uint uVar8;
  bool bVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar11;
  entry m;
  array local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  void *local_38;
  
  uVar8 = in_EDX & 0x7f;
  if (uVar8 == 0) {
    uVar5 = this->_flags & 0x10;
    bVar7 = this->_flags & 8;
  }
  else if (uVar8 < this->_ignore) {
    bVar7 = this->_flags & 2;
    uVar5 = 1;
  }
  else {
    uVar5 = (uint)(this->_flags >> 6) & in_EDX >> 5 & 1;
    bVar7 = this->_flags & 1;
  }
  uVar1._0_1_ = this->_flags;
  uVar1._1_1_ = this->_ignore;
  uVar1._2_1_ = this->_level;
  uVar1._3_1_ = this->field_0x1f;
  bVar9 = (this->super_reference<mpt::metatype>)._ref != (metatype *)0x0;
  bVar4 = (in_EDX >> 3 & uVar1 & 4) != 0;
  if (uVar5 == 0) {
    if ((bVar4 || bVar7 != 0) && bVar9) {
      dVar3 = (double)mpt_convertable_vlog();
      return dVar3;
    }
  }
  else {
    if ((bVar4 || bVar7 != 0) && bVar9) {
      local_38 = in_R8->reg_save_area;
      local_48._buf._ref._0_4_ = in_R8->gp_offset;
      local_48._buf._ref._4_4_ = in_R8->fp_offset;
      uStack_40 = *(undefined4 *)&in_R8->overflow_arg_area;
      uStack_3c = *(undefined4 *)((long)&in_R8->overflow_arg_area + 4);
      mpt_convertable_vlog();
    }
    array::array(&local_48,0);
    if ((uVar8 != 0) && (uVar8 < this->_level)) {
      this->_level = (uint8_t)uVar8;
    }
    iVar6 = entry::set((entry *)&local_48,in_RSI,in_EDX,in_RCX,in_R8);
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    if (-1 < iVar6) {
      pcVar2 = (this->_msg).super_unique_array<mpt::message_store::entry>._ref._ref;
      if (pcVar2 == (content<mpt::message_store::entry> *)0x0) {
        pos = 0;
      }
      else {
        pos = (pcVar2->super_buffer)._used >> 3;
      }
      typed_array<mpt::message_store::entry>::insert(&this->_msg,pos,(entry *)&local_48);
      uVar10 = extraout_XMM0_Da_00;
      uVar11 = extraout_XMM0_Db_00;
    }
    __x = (double)CONCAT44(uVar11,uVar10);
    if ((long *)CONCAT44(local_48._buf._ref._4_4_,(uint)local_48._buf._ref) != (long *)0x0) {
      __x = (double)(**(code **)(*(long *)CONCAT44(local_48._buf._ref._4_4_,(uint)local_48._buf._ref
                                                  ) + 8))();
    }
  }
  return __x;
}

Assistant:

int message_store::log(const char *from, int type, const char *fmt, va_list arg)
{
	int save = 0, pass = 0, code = 0x7f & type;
	
	if (!code) {
		save |= _flags & SaveMessage;
		pass |= _flags & PassMessage;
	}
	else if (code >= _ignore) {
		save = (type & File) && (_flags & SaveLogAll);
		pass |= _flags & PassUnsaved;
	} else {
		save = 1;
		pass |= _flags & PassSaved;
	}
	if (type & File) {
		pass |= _flags & PassFile;
	}
	metatype *mt = instance();
	// fast-track without argument list copy
	if (!save) {
		if (mt && pass) {
			return mpt_convertable_vlog(mt, from, type, fmt, arg);
		}
		return 0;
	}
	int ret;
	if (mt && pass) {
		va_list tmp;
		// use copy to keep data for storage operation
		va_copy(tmp, arg);
		ret = mpt_convertable_vlog(mt, from, type, fmt, tmp);
		va_end(tmp);
	}
	entry m;
	
	if (code && code < _level) _level = code;
	
	if ((ret = m.set(from, type, fmt, arg)) < 0) {
		return ret;
	}
	if (!_msg.insert(_msg.length(), m)) {
		return -1;
	}
	return ret;
}